

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_mem.c
# Opt level: O0

int record_pool_block(amqp_pool_blocklist_t *x,void *block)

{
  size_t __size;
  void *pvVar1;
  undefined8 in_RSI;
  int *in_RDI;
  void *newbl;
  size_t blocklistlength;
  
  __size = (long)(*in_RDI + 1) << 3;
  if (*(long *)(in_RDI + 2) == 0) {
    pvVar1 = malloc(__size);
    *(void **)(in_RDI + 2) = pvVar1;
    if (*(long *)(in_RDI + 2) == 0) {
      return 0;
    }
  }
  else {
    pvVar1 = realloc(*(void **)(in_RDI + 2),__size);
    if (pvVar1 == (void *)0x0) {
      return 0;
    }
    *(void **)(in_RDI + 2) = pvVar1;
  }
  *(undefined8 *)(*(long *)(in_RDI + 2) + (long)*in_RDI * 8) = in_RSI;
  *in_RDI = *in_RDI + 1;
  return 1;
}

Assistant:

static int record_pool_block(amqp_pool_blocklist_t *x, void *block)
{
  size_t blocklistlength = sizeof(void *) * (x->num_blocks + 1);

  if (x->blocklist == NULL) {
    x->blocklist = malloc(blocklistlength);
    if (x->blocklist == NULL) {
      return 0;
    }
  } else {
    void *newbl = realloc(x->blocklist, blocklistlength);
    if (newbl == NULL) {
      return 0;
    }
    x->blocklist = newbl;
  }

  x->blocklist[x->num_blocks] = block;
  x->num_blocks++;
  return 1;
}